

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O3

char * CVmObjBigNum::calc_asin_series(char *ext1,char *ext2,char *ext3,char *ext4,char *ext5)

{
  ushort *ext1_00;
  unsigned_long uVar1;
  ulong val;
  char *ext1_01;
  char *local_40;
  
  copy_val(ext2,ext1,0);
  compute_prod_into(ext3,ext1,ext1);
  val = 1;
  local_40 = ext5;
  while( true ) {
    ext1_01 = ext2;
    ext1_00 = (ushort *)ext1;
    val = val + 2;
    copy_val(ext4,(char *)"\x01",0);
    if (3 < val) {
      uVar1 = 3;
      do {
        mul_by_long(ext4,uVar1);
        uVar1 = uVar1 + 2;
      } while (uVar1 < val);
    }
    if (2 < val) {
      uVar1 = 2;
      do {
        div_by_long(ext4,uVar1,(unsigned_long *)0x0);
        uVar1 = uVar1 + 2;
      } while (uVar1 < val);
    }
    div_by_long(ext4,val,(unsigned_long *)0x0);
    compute_prod_into(local_40,ext1_01,ext3);
    compute_prod_into(ext1_01,local_40,ext4);
    if (((ext1_01[4] & 8U) != 0) ||
       ((int)(uint)*ext1_00 < (int)(short)ext1_00[1] - (int)*(short *)(ext1_01 + 2))) break;
    compute_sum_into(ext4,(char *)ext1_00,ext1_01);
    ext1 = ext4;
    ext2 = local_40;
    ext4 = (char *)ext1_00;
    local_40 = ext1_01;
  }
  return (char *)ext1_00;
}

Assistant:

char *CVmObjBigNum::calc_asin_series(char *ext1, char *ext2,
                                     char *ext3, char *ext4, char *ext5)
{
    ulong n;

    /* get the current power of x (1) into the x power register, r2 */
    copy_val(ext2, ext1, FALSE);
    
    /* 
     *   compute x^2 into r3 - we'll multiply the previous power by this
     *   to get the next power (we need x^1, x^3, x^5, etc) 
     */
    compute_prod_into(ext3, ext1, ext1);

    /* start at the first term */
    n = 1;

    /* keep going until we have enough precision in the result */
    for (;;)
    {
        ulong i;
        char *tmp;
        
        /* move on to the next term */
        n += 2;
        
        /* 
         *   compute the next weirdness factor into r4:
         *   
         *    1*3*5*...*(n-2)
         *.  -----------------
         *.  2*4*6*...*(n-1)*n 
         */

        /* start out with 1 in r4 */
        copy_val(ext4, get_one(), FALSE);

        /* multiply by odd numbers up to but not including 'n' */
        for (i = 3 ; i < n ; i += 2)
            mul_by_long(ext4, i);
        
        /* 
         *   Divide by even numbers up to and including n-1.  Note that we
         *   use div_by_long() because it's faster than using a BigNumber
         *   divisor.  div_by_long() has a limit of ULONG_MAX/10 for the
         *   divisor; we shouldn't have to worry about exceeding that, since
         *   our maximum precision is 64k digits.  The series will converge
         *   to our maximum precision long before 'i' gets close to
         *   ULONG_MAX/10.  (Even if not, computing billions of series terms
         *   would take so long that we'd never get there anyway.)  
         */
        for (i = 2 ; i < n ; i += 2)
            div_by_long(ext4, i);
        
        /* divide by n */
        div_by_long(ext4, n);
        
        /* 
         *   compute the next power of x - multiply our current power of x
         *   (r2) by x^2 (r3) 
         */
        compute_prod_into(ext5, ext2, ext3);
        
        /* swap r5 into r2 - this new power of x is now current */
        tmp = ext5;
        ext5 = ext2;
        ext2 = tmp;
        
        /* 
         *   multiply the current x power by the current weirdness factor
         *   - this will yield the current term into r5 
         */
        compute_prod_into(ext5, ext2, ext4);

        /* 
         *   if this value is too small to show up in our accumulator,
         *   we're done 
         */
        if (is_zero(ext5)
            || get_exp(ext1) - get_exp(ext5) > (int)get_prec(ext1))
            break;

        /* 
         *   we can trash the weird factor now - use it as a scratch pad
         *   for adding the accumulator so far (r1) to this term 
         */
        compute_sum_into(ext4, ext1, ext5);

        /* swap the result into r1, since it's the new accumulator */
        tmp = ext4;
        ext4 = ext1;
        ext1 = tmp;
    }

    /* return the accumulator register */
    return ext1;
}